

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FractionalDigitGenerator::
FractionalDigitGenerator(FractionalDigitGenerator *this,Span<unsigned_int> data,uint128 v,int exp)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  reference puVar4;
  uint128 lhs;
  size_type local_60;
  size_t pos;
  uint128 local_48;
  int local_38;
  int local_34;
  int offset;
  int exp_local;
  FractionalDigitGenerator *this_local;
  uint128 v_local;
  Span<unsigned_int> data_local;
  
  v_local.lo_ = v.hi_;
  this_local = (FractionalDigitGenerator *)v.lo_;
  v_local.hi_ = (uint64_t)data.ptr_;
  this->after_chunk_index_ = (long)(exp / 0x20 + 1);
  local_34 = exp;
  _offset = this;
  Span<unsigned_int>::
  Span<absl::lts_20250127::Span<unsigned_int>,_void,_absl::lts_20250127::Span<unsigned_int>,_0>
            (&this->data_,(Span<unsigned_int> *)&v_local.hi_);
  local_38 = local_34 % 0x20;
  lhs.hi_._0_4_ = 0x20 - local_38;
  lhs.lo_ = v_local.lo_;
  lhs.hi_._4_4_ = 0;
  local_48 = lts_20250127::operator<<((lts_20250127 *)this_local,lhs,0x20);
  uVar3 = uint128::operator_cast_to_unsigned_int(&local_48);
  puVar4 = Span<unsigned_int>::operator[](&this->data_,this->after_chunk_index_ - 1);
  *puVar4 = uVar3;
  uint128::operator>>=((uint128 *)&this_local,local_38);
  local_60 = this->after_chunk_index_ - 1;
  while( true ) {
    bVar1 = uint128::operator_cast_to_bool((uint128 *)&this_local);
    if (!bVar1) break;
    uVar3 = uint128::operator_cast_to_unsigned_int((uint128 *)&this_local);
    local_60 = local_60 - 1;
    puVar4 = Span<unsigned_int>::operator[](&this->data_,local_60);
    *puVar4 = uVar3;
    uint128::operator>>=((uint128 *)&this_local,0x20);
  }
  cVar2 = GetOneDigit(this);
  this->next_digit_ = cVar2;
  return;
}

Assistant:

FractionalDigitGenerator(absl::Span<uint32_t> data, uint128 v, int exp)
      : after_chunk_index_(static_cast<size_t>(exp / 32 + 1)), data_(data) {
    const int offset = exp % 32;
    // Right shift `v` by `exp` bits.
    data_[after_chunk_index_ - 1] = static_cast<uint32_t>(v << (32 - offset));
    v >>= offset;
    // Make sure we don't overflow the data. We already calculated that
    // non-zero bits fit, so we might not have space for leading zero bits.
    for (size_t pos = after_chunk_index_ - 1; v; v >>= 32)
      data_[--pos] = static_cast<uint32_t>(v);

    // Fill next_digit_, as GetDigits expects it to be populated always.
    next_digit_ = GetOneDigit();
  }